

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_app.h
# Opt level: O1

void sapp_set_window_title(char *title)

{
  char cVar1;
  long lVar2;
  
  if (title != (char *)0x0) {
    lVar2 = 0;
    do {
      cVar1 = *title;
      title = title + (cVar1 != '\0');
      _sapp.window_title[lVar2] = cVar1;
      lVar2 = lVar2 + 1;
    } while ((int)lVar2 != 0x80);
    if (cVar1 != '\0') {
      _sapp.window_title[0x7f] = '\0';
    }
    _sapp_x11_update_window_title();
    return;
  }
  __assert_fail("title",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/sokol-src/sokol_app.h"
                ,0x2f3f,"void sapp_set_window_title(const char *)");
}

Assistant:

SOKOL_API_IMPL void sapp_set_window_title(const char* title) {
    SOKOL_ASSERT(title);
    _sapp_strcpy(title, _sapp.window_title, sizeof(_sapp.window_title));
    #if defined(_SAPP_MACOS)
        _sapp_macos_update_window_title();
    #elif defined(_SAPP_WIN32)
        _sapp_win32_update_window_title();
    #elif defined(_SAPP_LINUX)
        _sapp_x11_update_window_title();
    #endif
}